

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>::
AdapterPromiseNode<kj::_::WeakFulfiller<void>&>
          (AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>> *this,
          WeakFulfiller<void> *params)

{
  WeakFulfiller<void> *wrapper;
  WeakFulfiller<void> *params_local;
  AdapterPromiseNode<kj::_::Void,_kj::_::PromiseAndFulfillerAdapter<void>_> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<void>::PromiseFulfiller((PromiseFulfiller<void> *)(this + 0x18));
  *(undefined ***)this = &PTR_destroy_00d72a88;
  *(undefined ***)(this + 0x18) = &PTR_reject_00d72ad8;
  ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)(this + 0x20));
  this[0x1c0] = (AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>)0x1;
  wrapper = fwd<kj::_::WeakFulfiller<void>&>(params);
  PromiseAndFulfillerAdapter<void>::PromiseAndFulfillerAdapter
            ((PromiseAndFulfillerAdapter<void> *)(this + 0x1c8),
             (PromiseFulfiller<void> *)(this + 0x18),wrapper);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}